

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

ShaderResources * __thiscall
spirv_cross::Compiler::get_shader_resources
          (ShaderResources *__return_storage_ptr__,Compiler *this,
          unordered_set<spirv_cross::TypedID<(spirv_cross::Types)2>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>_>
          *active_variables)

{
  uint uVar1;
  ID IVar2;
  uint32_t uVar3;
  size_t sVar4;
  Variant *pVVar5;
  pointer pcVar6;
  bool fallback_prefer_instance_name;
  bool bVar7;
  StorageClass SVar8;
  SPIRVariable *var;
  SPIRType *pSVar9;
  __node_base_ptr p_Var10;
  string *psVar11;
  ShaderResources *this_00;
  long lVar12;
  undefined1 local_d8 [16];
  string local_c8;
  ParsedIR *local_a8;
  ShaderResources *local_a0;
  ShaderResources *local_98;
  ShaderResources *local_90;
  LoopLock local_88;
  ShaderResources *local_80;
  ShaderResources *local_78;
  ShaderResources *local_70;
  ShaderResources *local_68;
  ShaderResources *local_60;
  ShaderResources *local_58;
  ShaderResources *local_50;
  ShaderResources *local_48;
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_40;
  TypedID<(spirv_cross::Types)0> *local_38;
  
  (__return_storage_ptr__->uniform_buffers).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->uniform_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->uniform_buffers).stack_storage;
  (__return_storage_ptr__->uniform_buffers).buffer_capacity = 8;
  (__return_storage_ptr__->storage_buffers).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->storage_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->storage_buffers).stack_storage;
  (__return_storage_ptr__->storage_buffers).buffer_capacity = 8;
  (__return_storage_ptr__->stage_inputs).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->stage_inputs).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->stage_inputs).stack_storage;
  (__return_storage_ptr__->stage_inputs).buffer_capacity = 8;
  (__return_storage_ptr__->stage_outputs).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->stage_outputs).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->stage_outputs).stack_storage;
  (__return_storage_ptr__->stage_outputs).buffer_capacity = 8;
  (__return_storage_ptr__->subpass_inputs).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->subpass_inputs).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->subpass_inputs).stack_storage;
  (__return_storage_ptr__->subpass_inputs).buffer_capacity = 8;
  (__return_storage_ptr__->storage_images).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->storage_images).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->storage_images).stack_storage;
  (__return_storage_ptr__->storage_images).buffer_capacity = 8;
  (__return_storage_ptr__->sampled_images).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->sampled_images).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->sampled_images).stack_storage;
  (__return_storage_ptr__->sampled_images).buffer_capacity = 8;
  (__return_storage_ptr__->atomic_counters).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->atomic_counters).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->atomic_counters).stack_storage;
  (__return_storage_ptr__->atomic_counters).buffer_capacity = 8;
  (__return_storage_ptr__->acceleration_structures).super_VectorView<spirv_cross::Resource>.
  buffer_size = 0;
  (__return_storage_ptr__->acceleration_structures).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->acceleration_structures).stack_storage;
  (__return_storage_ptr__->acceleration_structures).buffer_capacity = 8;
  (__return_storage_ptr__->push_constant_buffers).super_VectorView<spirv_cross::Resource>.
  buffer_size = 0;
  (__return_storage_ptr__->push_constant_buffers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->push_constant_buffers).stack_storage;
  (__return_storage_ptr__->push_constant_buffers).buffer_capacity = 8;
  (__return_storage_ptr__->separate_images).super_VectorView<spirv_cross::Resource>.buffer_size = 0;
  (__return_storage_ptr__->separate_images).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->separate_images).stack_storage;
  (__return_storage_ptr__->separate_images).buffer_capacity = 8;
  (__return_storage_ptr__->separate_samplers).super_VectorView<spirv_cross::Resource>.buffer_size =
       0;
  (__return_storage_ptr__->separate_samplers).super_VectorView<spirv_cross::Resource>.ptr =
       (Resource *)&(__return_storage_ptr__->separate_samplers).stack_storage;
  (__return_storage_ptr__->separate_samplers).buffer_capacity = 8;
  fallback_prefer_instance_name = reflection_ssbo_instance_name_is_significant(this);
  local_a8 = &this->ir;
  local_40 = &active_variables->_M_h;
  ParsedIR::create_loop_hard_lock(local_a8);
  sVar4 = (this->ir).ids_for_type[2].super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
          buffer_size;
  if (sVar4 != 0) {
    local_a0 = (ShaderResources *)&__return_storage_ptr__->storage_buffers;
    local_90 = (ShaderResources *)&__return_storage_ptr__->stage_inputs;
    local_98 = (ShaderResources *)&__return_storage_ptr__->stage_outputs;
    local_48 = (ShaderResources *)&__return_storage_ptr__->subpass_inputs;
    local_60 = (ShaderResources *)&__return_storage_ptr__->storage_images;
    local_70 = (ShaderResources *)&__return_storage_ptr__->sampled_images;
    local_50 = (ShaderResources *)&__return_storage_ptr__->atomic_counters;
    local_78 = (ShaderResources *)&__return_storage_ptr__->acceleration_structures;
    local_58 = (ShaderResources *)&__return_storage_ptr__->push_constant_buffers;
    local_68 = (ShaderResources *)&__return_storage_ptr__->separate_images;
    local_80 = (ShaderResources *)&__return_storage_ptr__->separate_samplers;
    local_38 = (this->ir).ids_for_type[2].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar12 = 0;
    do {
      uVar1 = *(uint *)((long)&local_38->id + lVar12);
      pVVar5 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[uVar1].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar5 + uVar1);
        pSVar9 = Variant::get<spirv_cross::SPIRType>
                           ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(var->super_IVariant).field_0xc);
        if (((var->storage != StorageClassFunction) && (pSVar9->pointer == true)) &&
           (bVar7 = is_builtin_variable(this,var), !bVar7)) {
          if (local_40 !=
              (_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)0x0) {
            IVar2.id = (var->super_IVariant).self.id;
            local_d8._0_4_ = IVar2.id;
            p_Var10 = ::std::
                      _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)2>,_spirv_cross::TypedID<(spirv_cross::Types)2>,_std::allocator<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Identity,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)2>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::_M_find_before_node
                                (local_40,(ulong)IVar2.id % local_40->_M_bucket_count,
                                 (key_type *)local_d8,(ulong)IVar2.id);
            if ((p_Var10 == (__node_base_ptr)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0))
            goto LAB_002b78de;
          }
          SVar8 = var->storage;
          if (SVar8 == StorageClassInput) {
            bVar7 = interface_variable_exists_in_entry_point(this,(var->super_IVariant).self.id);
            if (!bVar7) {
              SVar8 = var->storage;
              goto LAB_002b75c3;
            }
            bVar7 = ParsedIR::has_decoration
                              (local_a8,(ID)(pSVar9->super_IVariant).self.id,DecorationBlock);
            if (bVar7) {
              local_d8._0_4_ = (var->super_IVariant).self;
              local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
              local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
              get_remapped_declared_block_name_abi_cxx11_
                        ((string *)(local_d8 + 0x10),this,local_d8._0_4_,false);
              this_00 = local_90;
            }
            else {
              local_d8._0_4_ = (var->super_IVariant).self;
              local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
              local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
              psVar11 = ParsedIR::get_name_abi_cxx11_(local_a8,(ID)local_d8._0_4_);
              local_c8._M_dataplus._M_p = local_d8 + 0x20;
              pcVar6 = (psVar11->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_d8 + 0x10),pcVar6,pcVar6 + psVar11->_M_string_length);
              this_00 = local_90;
            }
          }
          else {
LAB_002b75c3:
            if ((SVar8 == StorageClassUniformConstant) && ((pSVar9->image).dim == DimSubpassData)) {
              local_d8._0_4_ = (var->super_IVariant).self;
              local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
              local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
              psVar11 = ParsedIR::get_name_abi_cxx11_(local_a8,(ID)local_d8._0_4_);
              local_c8._M_dataplus._M_p = local_d8 + 0x20;
              pcVar6 = (psVar11->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_d8 + 0x10),pcVar6,pcVar6 + psVar11->_M_string_length);
              this_00 = local_48;
            }
            else if ((SVar8 == StorageClassOutput) &&
                    (bVar7 = interface_variable_exists_in_entry_point
                                       (this,(var->super_IVariant).self.id), bVar7)) {
              bVar7 = ParsedIR::has_decoration
                                (local_a8,(ID)(pSVar9->super_IVariant).self.id,DecorationBlock);
              if (bVar7) {
                local_d8._0_4_ = (var->super_IVariant).self;
                local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
                get_remapped_declared_block_name_abi_cxx11_
                          ((string *)(local_d8 + 0x10),this,local_d8._0_4_,false);
                this_00 = local_98;
              }
              else {
                local_d8._0_4_ = (var->super_IVariant).self;
                local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
                psVar11 = ParsedIR::get_name_abi_cxx11_(local_a8,(ID)local_d8._0_4_);
                local_c8._M_dataplus._M_p = local_d8 + 0x20;
                pcVar6 = (psVar11->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)(local_d8 + 0x10),pcVar6,pcVar6 + psVar11->_M_string_length);
                this_00 = local_98;
              }
            }
            else {
              SVar8 = pSVar9->storage;
              if (SVar8 == StorageClassUniform) {
                bVar7 = ParsedIR::has_decoration
                                  (local_a8,(ID)(pSVar9->super_IVariant).self.id,DecorationBlock);
                if (bVar7) {
                  local_d8._0_4_ = (var->super_IVariant).self;
                  local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                  local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
                  get_remapped_declared_block_name_abi_cxx11_
                            ((string *)(local_d8 + 0x10),this,local_d8._0_4_,false);
                  this_00 = __return_storage_ptr__;
                  goto LAB_002b78c0;
                }
                SVar8 = pSVar9->storage;
                if (SVar8 == StorageClassUniform) {
                  bVar7 = ParsedIR::has_decoration
                                    (local_a8,(ID)(pSVar9->super_IVariant).self.id,
                                     DecorationBufferBlock);
                  if (bVar7) {
                    local_d8._0_4_ = (var->super_IVariant).self;
                    local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                    local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
                    get_remapped_declared_block_name_abi_cxx11_
                              ((string *)(local_d8 + 0x10),this,local_d8._0_4_,
                               fallback_prefer_instance_name);
                    this_00 = local_a0;
                    goto LAB_002b78c0;
                  }
                  SVar8 = pSVar9->storage;
                }
              }
              if ((int)SVar8 < 10) {
                if (SVar8 == StorageClassUniformConstant) {
                  uVar1 = *(uint *)&(pSVar9->super_IVariant).field_0xc;
                  uVar3 = (pSVar9->image).sampled;
                  if (uVar3 == 2 && (uVar1 ^ 0x10) == 0) {
                    local_d8._0_4_ = (var->super_IVariant).self;
                    local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                    local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
                    psVar11 = ParsedIR::get_name_abi_cxx11_(local_a8,(ID)local_d8._0_4_);
                    local_c8._M_dataplus._M_p = local_d8 + 0x20;
                    pcVar6 = (psVar11->_M_dataplus)._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)(local_d8 + 0x10),pcVar6,pcVar6 + psVar11->_M_string_length
                              );
                    this_00 = local_60;
                  }
                  else if ((uVar1 ^ 0x10) == 0 && uVar3 == 1) {
                    local_d8._0_4_ = (var->super_IVariant).self;
                    local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                    local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
                    psVar11 = ParsedIR::get_name_abi_cxx11_(local_a8,(ID)local_d8._0_4_);
                    local_c8._M_dataplus._M_p = local_d8 + 0x20;
                    pcVar6 = (psVar11->_M_dataplus)._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)(local_d8 + 0x10),pcVar6,pcVar6 + psVar11->_M_string_length
                              );
                    this_00 = local_68;
                  }
                  else if (uVar1 == 0x11) {
                    local_d8._0_4_ = (var->super_IVariant).self;
                    local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                    local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
                    psVar11 = ParsedIR::get_name_abi_cxx11_(local_a8,(ID)local_d8._0_4_);
                    local_c8._M_dataplus._M_p = local_d8 + 0x20;
                    pcVar6 = (psVar11->_M_dataplus)._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)(local_d8 + 0x10),pcVar6,pcVar6 + psVar11->_M_string_length
                              );
                    this_00 = local_70;
                  }
                  else if (uVar1 == 0x13) {
                    local_d8._0_4_ = (var->super_IVariant).self;
                    local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                    local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
                    psVar11 = ParsedIR::get_name_abi_cxx11_(local_a8,(ID)local_d8._0_4_);
                    local_c8._M_dataplus._M_p = local_d8 + 0x20;
                    pcVar6 = (psVar11->_M_dataplus)._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)(local_d8 + 0x10),pcVar6,pcVar6 + psVar11->_M_string_length
                              );
                    this_00 = local_78;
                  }
                  else {
                    if (uVar1 != 0x12) goto LAB_002b78de;
                    local_d8._0_4_ = (var->super_IVariant).self;
                    local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                    local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
                    psVar11 = ParsedIR::get_name_abi_cxx11_(local_a8,(ID)local_d8._0_4_);
                    local_c8._M_dataplus._M_p = local_d8 + 0x20;
                    pcVar6 = (psVar11->_M_dataplus)._M_p;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)(local_d8 + 0x10),pcVar6,pcVar6 + psVar11->_M_string_length
                              );
                    this_00 = local_80;
                  }
                }
                else {
                  if (SVar8 != StorageClassPushConstant) goto LAB_002b78de;
                  local_d8._0_4_ = (var->super_IVariant).self;
                  local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                  local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
                  psVar11 = ParsedIR::get_name_abi_cxx11_(local_a8,(ID)local_d8._0_4_);
                  local_c8._M_dataplus._M_p = local_d8 + 0x20;
                  pcVar6 = (psVar11->_M_dataplus)._M_p;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)(local_d8 + 0x10),pcVar6,pcVar6 + psVar11->_M_string_length);
                  this_00 = local_58;
                }
              }
              else if (SVar8 == StorageClassAtomicCounter) {
                local_d8._0_4_ = (var->super_IVariant).self;
                local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
                psVar11 = ParsedIR::get_name_abi_cxx11_(local_a8,(ID)local_d8._0_4_);
                local_c8._M_dataplus._M_p = local_d8 + 0x20;
                pcVar6 = (psVar11->_M_dataplus)._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)(local_d8 + 0x10),pcVar6,pcVar6 + psVar11->_M_string_length);
                this_00 = local_50;
              }
              else {
                if (SVar8 != StorageClassStorageBuffer) goto LAB_002b78de;
                local_d8._0_4_ = (var->super_IVariant).self;
                local_d8._4_4_ = *(undefined4 *)&(var->super_IVariant).field_0xc;
                local_d8._8_4_ = (pSVar9->super_IVariant).self.id;
                get_remapped_declared_block_name_abi_cxx11_
                          ((string *)(local_d8 + 0x10),this,local_d8._0_4_,
                           fallback_prefer_instance_name);
                this_00 = local_a0;
              }
            }
          }
LAB_002b78c0:
          SmallVector<spirv_cross::Resource,_8UL>::push_back
                    (&this_00->uniform_buffers,(Resource *)local_d8);
          if (local_c8._M_dataplus._M_p != local_d8 + 0x20) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
        }
      }
LAB_002b78de:
      lVar12 = lVar12 + 4;
    } while (sVar4 << 2 != lVar12);
  }
  ParsedIR::LoopLock::~LoopLock(&local_88);
  return __return_storage_ptr__;
}

Assistant:

ShaderResources Compiler::get_shader_resources(const unordered_set<VariableID> *active_variables) const
{
	ShaderResources res;

	bool ssbo_instance_name = reflection_ssbo_instance_name_is_significant();

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, const SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		// It is possible for uniform storage classes to be passed as function parameters, so detect
		// that. To detect function parameters, check of StorageClass of variable is function scope.
		if (var.storage == StorageClassFunction || !type.pointer || is_builtin_variable(var))
			return;

		if (active_variables && active_variables->find(var.self) == end(*active_variables))
			return;

		// Input
		if (var.storage == StorageClassInput && interface_variable_exists_in_entry_point(var.self))
		{
			if (has_decoration(type.self, DecorationBlock))
			{
				res.stage_inputs.push_back(
				    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, false) });
			}
			else
				res.stage_inputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Subpass inputs
		else if (var.storage == StorageClassUniformConstant && type.image.dim == DimSubpassData)
		{
			res.subpass_inputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Outputs
		else if (var.storage == StorageClassOutput && interface_variable_exists_in_entry_point(var.self))
		{
			if (has_decoration(type.self, DecorationBlock))
			{
				res.stage_outputs.push_back(
				    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, false) });
			}
			else
				res.stage_outputs.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// UBOs
		else if (type.storage == StorageClassUniform && has_decoration(type.self, DecorationBlock))
		{
			res.uniform_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, false) });
		}
		// Old way to declare SSBOs.
		else if (type.storage == StorageClassUniform && has_decoration(type.self, DecorationBufferBlock))
		{
			res.storage_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, ssbo_instance_name) });
		}
		// Modern way to declare SSBOs.
		else if (type.storage == StorageClassStorageBuffer)
		{
			res.storage_buffers.push_back(
			    { var.self, var.basetype, type.self, get_remapped_declared_block_name(var.self, ssbo_instance_name) });
		}
		// Push constant blocks
		else if (type.storage == StorageClassPushConstant)
		{
			// There can only be one push constant block, but keep the vector in case this restriction is lifted
			// in the future.
			res.push_constant_buffers.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Images
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::Image &&
		         type.image.sampled == 2)
		{
			res.storage_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Separate images
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::Image &&
		         type.image.sampled == 1)
		{
			res.separate_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Separate samplers
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::Sampler)
		{
			res.separate_samplers.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Textures
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::SampledImage)
		{
			res.sampled_images.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Atomic counters
		else if (type.storage == StorageClassAtomicCounter)
		{
			res.atomic_counters.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
		// Acceleration structures
		else if (type.storage == StorageClassUniformConstant && type.basetype == SPIRType::AccelerationStructure)
		{
			res.acceleration_structures.push_back({ var.self, var.basetype, type.self, get_name(var.self) });
		}
	});

	return res;
}